

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_urlglob.c
# Opt level: O0

void glob_cleanup(URLGlob *glob)

{
  int local_1c;
  ulong uStack_18;
  int elem;
  size_t i;
  URLGlob *glob_local;
  
  for (uStack_18 = 0; uStack_18 < glob->size; uStack_18 = uStack_18 + 1) {
    if ((glob->pattern[uStack_18].type == UPTSet) &&
       (glob->pattern[uStack_18].content.Set.elements != (char **)0x0)) {
      local_1c = glob->pattern[uStack_18].content.Set.size;
      while (local_1c = local_1c + -1, -1 < local_1c) {
        free(glob->pattern[uStack_18].content.Set.elements[local_1c]);
        glob->pattern[uStack_18].content.Set.elements[local_1c] = (char *)0x0;
      }
      free(glob->pattern[uStack_18].content.Set.elements);
      glob->pattern[uStack_18].content.Set.elements = (char **)0x0;
    }
  }
  free(glob->glob_buffer);
  glob->glob_buffer = (char *)0x0;
  free(glob);
  return;
}

Assistant:

void glob_cleanup(URLGlob* glob)
{
  size_t i;
  int elem;

  for(i = 0; i < glob->size; i++) {
    if((glob->pattern[i].type == UPTSet) &&
       (glob->pattern[i].content.Set.elements)) {
      for(elem = glob->pattern[i].content.Set.size - 1;
          elem >= 0;
          --elem) {
        Curl_safefree(glob->pattern[i].content.Set.elements[elem]);
      }
      Curl_safefree(glob->pattern[i].content.Set.elements);
    }
  }
  Curl_safefree(glob->glob_buffer);
  Curl_safefree(glob);
}